

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O3

tuple<unsigned_char_*,_unsigned_long> __thiscall
SL::WS_LITE::WebSocketContext::Inflate(WebSocketContext *this,uchar *data,size_t data_len)

{
  uchar *puVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  undefined4 in_ECX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  _Head_base<0UL,_unsigned_char_*,_false> _Var8;
  uchar *extraout_RDX_02;
  size_t sVar9;
  tuple<unsigned_char_*,_unsigned_long> tVar10;
  ostringstream buffersl134nonesd;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  puVar1 = data + 0x18;
  *(size_t *)(data + 0x18) = data_len;
  *(undefined4 *)(data + 0x20) = in_ECX;
  pvVar7 = *(void **)(data + 0x10);
  do {
    *(void **)(data + 0x30) = pvVar7;
    data[0x38] = '\0';
    data[0x39] = '\0';
    data[0x3a] = '\x10';
    data[0x3b] = '\0';
    iVar5 = inflate(puVar1,4);
    if (*(int *)(data + 0x20) == 0) {
LAB_0012ae4e:
      inflateReset(puVar1);
      _Var8._M_head_impl = extraout_RDX_00;
      if ((iVar5 == 0) || (iVar5 == -5)) goto LAB_0012ae63;
      goto LAB_0012af97;
    }
    uVar2 = *(uint *)(data + 0x38);
    sVar9 = *(long *)(data + 8) + (0x100000 - (ulong)uVar2);
    *(size_t *)(data + 8) = sVar9;
    pvVar6 = realloc(*(void **)data,sVar9);
    *(void **)data = pvVar6;
    if (pvVar6 == (void *)0x0) {
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,"INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc ",0x34)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
      Log(ERROR_log_level,
          "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketContext.h"
          ,0x3e,"Inflate",(ostringstream *)aoStack_1a8);
      goto LAB_0012af7e;
    }
    pvVar7 = *(void **)(data + 0x10);
    memcpy((void *)((long)pvVar6 + sVar9),pvVar7,0x100000 - (ulong)uVar2);
    if (iVar5 != -5) goto LAB_0012ae4e;
  } while (*(ulong *)(data + 8) <= *(ulong *)(data + 0x138));
  inflateReset(puVar1);
  _Var8._M_head_impl = extraout_RDX;
LAB_0012ae63:
  uVar3 = *(ulong *)(data + 8);
  if (uVar3 <= *(ulong *)(data + 0x138)) {
    if (uVar3 == 0) {
      sVar4 = *(size_t *)(data + 0x10);
      _Var8._M_head_impl = (uchar *)(0x100000 - (ulong)*(uint *)(data + 0x38));
      this->InflateBuffer = _Var8._M_head_impl;
      this->InflateBufferSize = sVar4;
      goto LAB_0012af9d;
    }
    uVar2 = *(uint *)(data + 0x38);
    sVar9 = uVar3 + (0x100000 - (ulong)uVar2);
    *(size_t *)(data + 8) = sVar9;
    pvVar7 = realloc(*(void **)data,sVar9);
    *(void **)data = pvVar7;
    if (pvVar7 != (void *)0x0) {
      memcpy((void *)(sVar9 + (long)pvVar7),*(void **)(data + 0x10),0x100000 - (ulong)uVar2);
      this->InflateBuffer = *(uchar **)(data + 8);
      this->InflateBufferSize = (size_t)pvVar7;
      _Var8._M_head_impl = extraout_RDX_01;
      goto LAB_0012af9d;
    }
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,"INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc ",0x34);
    std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
    Log(ERROR_log_level,
        "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketContext.h"
        ,0x4f,"Inflate",(ostringstream *)aoStack_1a8);
LAB_0012af7e:
    std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
    std::ios_base::~ios_base(local_138);
    _Var8._M_head_impl = extraout_RDX_02;
  }
LAB_0012af97:
  this->InflateBuffer = (uchar *)0x0;
  this->InflateBufferSize = 0;
LAB_0012af9d:
  tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var8._M_head_impl;
  tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_char_*,_unsigned_long>)
         tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>;
}

Assistant:

auto Inflate(unsigned char *data, size_t data_len)
        {
            InflationStream.next_in = (Bytef *)data;
            InflationStream.avail_in = data_len;

            int err;
            do {
                InflationStream.next_out = (Bytef *)TempInflateBuffer.get();
                InflationStream.avail_out = LARGE_BUFFER_SIZE;
                err = ::inflate(&InflationStream, Z_FINISH);
                if (!InflationStream.avail_in) {
                    break;
                }
                auto growsize = LARGE_BUFFER_SIZE - InflationStream.avail_out;
                InflateBufferSize += growsize;
                auto beforesize = InflateBufferSize;
                InflateBuffer = static_cast<unsigned char *>(realloc(InflateBuffer, InflateBufferSize));
                if (!InflateBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc " << InflateBufferSize);
                    return returnemptyinflate();
                }
                memcpy(InflateBuffer + beforesize, TempInflateBuffer.get(), growsize);
            } while (err == Z_BUF_ERROR && InflateBufferSize <= MaxPayload);

            inflateReset(&InflationStream);

            if ((err != Z_BUF_ERROR && err != Z_OK) || InflateBufferSize > MaxPayload) {
                return returnemptyinflate();
            }
            if (InflateBufferSize > 0) {
                auto growsize = LARGE_BUFFER_SIZE - InflationStream.avail_out;
                InflateBufferSize += growsize;
                auto beforesize = InflateBufferSize;
                InflateBuffer = static_cast<unsigned char *>(realloc(InflateBuffer, InflateBufferSize));
                if (!InflateBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc " << InflateBufferSize);
                    return returnemptyinflate();
                }
                memcpy(InflateBuffer + beforesize, TempInflateBuffer.get(), growsize);
                return std::make_tuple(InflateBuffer, InflateBufferSize);
            }
            return std::make_tuple(TempInflateBuffer.get(), LARGE_BUFFER_SIZE - (size_t)InflationStream.avail_out);
        }